

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

uint32_t FACT_INTERNAL_ParseAudioEngine(FACTAudioEngine *pEngine,FACTRuntimeParameters *pParams)

{
  undefined4 *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  FACTDSPParameter *pFVar5;
  uint uVar6;
  uint uVar7;
  FACTAudioCategory *pFVar8;
  FACTVariable *pFVar9;
  float *pfVar10;
  FACTRPC *pFVar11;
  uint32_t *puVar12;
  FACTRPCPoint *pFVar13;
  FACTDSPPreset *pFVar14;
  void *pvVar15;
  char **ppcVar16;
  char *pcVar17;
  char cVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort *puVar22;
  ushort *puVar23;
  ushort uVar24;
  ulong uVar25;
  uint32_t uVar26;
  long lVar27;
  float fVar28;
  ushort local_54;
  ushort *local_50;
  uint local_48;
  uint local_44;
  int *local_40;
  FACTRuntimeParameters *local_38;
  
  local_40 = (int *)pParams->pGlobalSettingsBuffer;
  iVar4 = *local_40;
  if ((iVar4 == 0x58475346) || (iVar4 == 0x46534758)) {
    uVar3 = *(ushort *)(local_40 + 1);
    uVar19 = uVar3 << 8 | uVar3 >> 8;
    if (iVar4 != 0x58475346) {
      uVar19 = uVar3;
    }
    if ((ushort)(uVar19 - 0x2f) < 0xfffc) {
      uVar26 = 0xfffffffe;
    }
    else {
      cVar18 = (char)((ushort)*(undefined2 *)((long)local_40 + 6) >> 8);
      if (iVar4 != 0x58475346) {
        cVar18 = (char)*(undefined2 *)((long)local_40 + 6);
      }
      if (cVar18 == '*') {
        if ((*(byte *)((long)local_40 + 0x12) & 0xfb) == 3) {
          uVar3 = *(ushort *)((long)local_40 + 0x13);
          uVar19 = uVar3 << 8 | uVar3 >> 8;
          if (iVar4 != 0x58475346) {
            uVar19 = uVar3;
          }
          pEngine->categoryCount = uVar19;
          uVar3 = *(ushort *)((long)local_40 + 0x15);
          uVar20 = uVar3 << 8 | uVar3 >> 8;
          if (iVar4 != 0x58475346) {
            uVar20 = uVar3;
          }
          pEngine->variableCount = uVar20;
          uVar3 = *(ushort *)((long)local_40 + 0x1b);
          uVar20 = *(ushort *)((long)local_40 + 0x17);
          uVar24 = *(ushort *)((long)local_40 + 0x19);
          uVar21 = uVar3 << 8 | uVar3 >> 8;
          if (iVar4 != 0x58475346) {
            uVar21 = uVar3;
          }
          pEngine->rpcCount = uVar21;
          uVar3 = *(ushort *)((long)local_40 + 0x1d);
          uVar21 = uVar3 << 8 | uVar3 >> 8;
          if (iVar4 != 0x58475346) {
            uVar21 = uVar3;
          }
          pEngine->dspPresetCount = uVar21;
          uVar3 = *(ushort *)((long)local_40 + 0x1f);
          uVar21 = uVar3 << 8 | uVar3 >> 8;
          if (iVar4 != 0x58475346) {
            uVar21 = uVar3;
          }
          local_48 = (uint)(ushort)(uVar20 << 8 | uVar20 >> 8);
          local_44 = (uint)(ushort)(uVar24 << 8 | uVar24 >> 8);
          pEngine->dspParameterCount = uVar21;
          puVar22 = (ushort *)((long)local_40 + 0x4d);
          local_38 = pParams;
          pFVar8 = (FACTAudioCategory *)(*pEngine->pMalloc)((ulong)uVar19 * 0x18);
          pEngine->categories = pFVar8;
          lVar27 = 0;
          for (uVar25 = 0; uVar25 < pEngine->categoryCount; uVar25 = uVar25 + 1) {
            (&pFVar8->instanceLimit)[lVar27] = (uint8_t)*puVar22;
            uVar3 = *(ushort *)((long)puVar22 + 1);
            uVar19 = uVar3 << 8 | uVar3 >> 8;
            if (iVar4 != 0x58475346) {
              uVar19 = uVar3;
            }
            *(ushort *)((long)&pFVar8->fadeInMS + lVar27) = uVar19;
            uVar3 = *(ushort *)((long)puVar22 + 3);
            uVar19 = uVar3 << 8 | uVar3 >> 8;
            if (iVar4 != 0x58475346) {
              uVar19 = uVar3;
            }
            *(ushort *)((long)&pFVar8->fadeOutMS + lVar27) = uVar19;
            (&pFVar8->maxInstanceBehavior)[lVar27] = *(byte *)((long)puVar22 + 5) >> 3;
            uVar3 = puVar22[3];
            uVar19 = uVar3 << 8 | uVar3 >> 8;
            if (iVar4 != 0x58475346) {
              uVar19 = uVar3;
            }
            local_50 = puVar22 + 4;
            *(ushort *)((long)&pFVar8->parentCategory + lVar27) = uVar19;
            fVar28 = read_volbyte((uint8_t **)&local_50);
            fVar28 = FACT_INTERNAL_CalculateAmplitudeRatio(fVar28);
            pFVar8 = pEngine->categories;
            *(float *)((long)&pFVar8->volume + lVar27) = fVar28;
            puVar22 = (ushort *)((long)local_50 + 1);
            (&pFVar8->visibility)[lVar27] = (uint8_t)*local_50;
            (&pFVar8->instanceCount)[lVar27] = '\0';
            *(undefined4 *)((long)&pFVar8->currentVolume + lVar27) = 0x3f800000;
            lVar27 = lVar27 + 0x18;
            local_50 = puVar22;
          }
          uVar6 = (uint)uVar20;
          if (iVar4 == 0x58475346) {
            uVar6 = local_48;
          }
          pFVar9 = (FACTVariable *)(*pEngine->pMalloc)((ulong)pEngine->variableCount << 4);
          pEngine->variables = pFVar9;
          uVar3 = pEngine->variableCount;
          for (lVar27 = 0; (ulong)uVar3 << 4 != lVar27; lVar27 = lVar27 + 0x10) {
            (&pFVar9->accessibility)[lVar27] = (uint8_t)*puVar22;
            *(undefined4 *)((long)&pFVar9->initialValue + lVar27) =
                 *(undefined4 *)((long)puVar22 + 1);
            *(undefined4 *)((long)&pFVar9->minValue + lVar27) = *(undefined4 *)((long)puVar22 + 5);
            puVar1 = (undefined4 *)((long)puVar22 + 9);
            puVar22 = (ushort *)((long)puVar22 + 0xd);
            *(undefined4 *)((long)&pFVar9->maxValue + lVar27) = *puVar1;
          }
          local_50 = puVar22;
          pfVar10 = (float *)(*pEngine->pMalloc)((ulong)((uint)uVar3 * 4));
          pEngine->globalVariableValues = pfVar10;
          uVar3 = pEngine->variableCount;
          for (lVar27 = 0; (ulong)uVar3 * 4 != lVar27; lVar27 = lVar27 + 4) {
            *(float *)((long)pfVar10 + lVar27) = (&pEngine->variables->initialValue)[lVar27];
          }
          uVar7 = (uint)uVar24;
          if (iVar4 == 0x58475346) {
            uVar7 = local_44;
          }
          puVar23 = local_50;
          if (pEngine->rpcCount != 0) {
            pFVar11 = (FACTRPC *)(*pEngine->pMalloc)((ulong)pEngine->rpcCount << 4);
            pEngine->rpcs = pFVar11;
            puVar12 = (uint32_t *)(*pEngine->pMalloc)((ulong)pEngine->rpcCount << 2);
            pEngine->rpcCodes = puVar12;
            for (uVar25 = 0; puVar23 = puVar22, uVar25 < pEngine->rpcCount; uVar25 = uVar25 + 1) {
              pEngine->rpcCodes[uVar25] = (int)puVar22 - (int)local_40;
              uVar3 = *puVar22;
              uVar19 = uVar3 << 8 | uVar3 >> 8;
              if (iVar4 != 0x58475346) {
                uVar19 = uVar3;
              }
              pFVar11 = pEngine->rpcs;
              pFVar11[uVar25].variable = uVar19;
              uVar19 = puVar22[1];
              pFVar11[uVar25].pointCount = (byte)uVar19;
              uVar3 = *(ushort *)((long)puVar22 + 3);
              uVar20 = uVar3 << 8 | uVar3 >> 8;
              if (iVar4 != 0x58475346) {
                uVar20 = uVar3;
              }
              puVar22 = (ushort *)((long)puVar22 + 5);
              pFVar11[uVar25].parameter = uVar20;
              pFVar13 = (FACTRPCPoint *)(*pEngine->pMalloc)((ulong)(byte)uVar19 * 0xc);
              pFVar11 = pEngine->rpcs;
              pFVar11[uVar25].points = pFVar13;
              bVar2 = pFVar11[uVar25].pointCount;
              for (lVar27 = 0; (ulong)bVar2 * 0xc - lVar27 != 0; lVar27 = lVar27 + 0xc) {
                *(undefined4 *)((long)&pFVar13->x + lVar27) = *(undefined4 *)puVar22;
                *(undefined4 *)((long)&pFVar13->y + lVar27) = *(undefined4 *)(puVar22 + 2);
                puVar23 = puVar22 + 4;
                puVar22 = (ushort *)((long)puVar22 + 9);
                (&pFVar13->type)[lVar27] = (uint8_t)*puVar23;
              }
            }
          }
          local_50 = puVar23;
          if (pEngine->dspPresetCount != 0) {
            pFVar14 = (FACTDSPPreset *)(*pEngine->pMalloc)((ulong)pEngine->dspPresetCount << 4);
            pEngine->dspPresets = pFVar14;
            puVar12 = (uint32_t *)(*pEngine->pMalloc)((ulong)pEngine->dspPresetCount << 2);
            pEngine->dspPresetCodes = puVar12;
            uVar26 = (int)puVar22 - (int)local_40;
            lVar27 = 0;
            puVar23 = puVar22;
            for (uVar25 = 0; uVar3 = pEngine->dspPresetCount, uVar25 < uVar3; uVar25 = uVar25 + 1) {
              pEngine->dspPresetCodes[uVar25] = uVar26;
              pFVar14 = pEngine->dspPresets;
              (&pFVar14->accessibility)[lVar27] = (uint8_t)*puVar23;
              uVar3 = *(ushort *)((long)puVar23 + 1);
              uVar19 = uVar3 << 8 | uVar3 >> 8;
              if (iVar4 != 0x58475346) {
                uVar19 = uVar3;
              }
              *(ushort *)((long)&pFVar14->parameterCount + lVar27) = uVar19;
              puVar23 = (ushort *)((long)puVar23 + 5);
              pvVar15 = (*pEngine->pMalloc)((ulong)uVar19 * 0x14);
              *(void **)((long)&pEngine->dspPresets->parameters + lVar27) = pvVar15;
              lVar27 = lVar27 + 0x10;
              uVar26 = uVar26 + 5;
            }
            puVar22 = puVar23;
            for (uVar25 = 0; local_50 = puVar23, uVar25 != uVar3; uVar25 = uVar25 + 1) {
              pFVar14 = pEngine->dspPresets;
              uVar19 = pFVar14[uVar25].parameterCount;
              for (lVar27 = 0; (ulong)uVar19 * 0x14 - lVar27 != 0; lVar27 = lVar27 + 0x14) {
                pFVar5 = pFVar14[uVar25].parameters;
                (&pFVar5->type)[lVar27] = (uint8_t)*puVar22;
                *(undefined4 *)((long)&pFVar5->value + lVar27) = *(undefined4 *)((long)puVar22 + 1);
                *(undefined4 *)((long)&pFVar5->minVal + lVar27) = *(undefined4 *)((long)puVar22 + 5)
                ;
                *(undefined4 *)((long)&pFVar5->maxVal + lVar27) = *(undefined4 *)((long)puVar22 + 9)
                ;
                uVar20 = *(ushort *)((long)puVar22 + 0xd);
                puVar22 = (ushort *)((long)puVar22 + 0xf);
                uVar24 = uVar20 << 8 | uVar20 >> 8;
                if (iVar4 != 0x58475346) {
                  uVar24 = uVar20;
                }
                *(ushort *)((long)&pFVar5->unknown + lVar27) = uVar24;
              }
            }
          }
          puVar22 = puVar22 + ((ulong)uVar6 & 0xffff) + (ulong)pEngine->categoryCount * 3;
          ppcVar16 = (char **)(*pEngine->pMalloc)((ulong)pEngine->categoryCount << 3);
          pEngine->categoryNames = ppcVar16;
          for (uVar25 = 0; uVar25 < pEngine->categoryCount; uVar25 = uVar25 + 1) {
            lVar27 = SDL_strlen(puVar22);
            pcVar17 = (char *)(*pEngine->pMalloc)(lVar27 + 1U);
            pEngine->categoryNames[uVar25] = pcVar17;
            SDL_memcpy(pEngine->categoryNames[uVar25],puVar22,lVar27 + 1U);
            puVar22 = (ushort *)((long)puVar22 + lVar27 + 1);
          }
          local_54 = (ushort)uVar7;
          puVar22 = puVar22 + (ulong)local_54 + (ulong)pEngine->variableCount * 3;
          ppcVar16 = (char **)(*pEngine->pMalloc)((ulong)pEngine->variableCount << 3);
          pEngine->variableNames = ppcVar16;
          for (uVar25 = 0; uVar25 < pEngine->variableCount; uVar25 = uVar25 + 1) {
            lVar27 = SDL_strlen(puVar22);
            pcVar17 = (char *)(*pEngine->pMalloc)(lVar27 + 1U);
            pEngine->variableNames[uVar25] = pcVar17;
            SDL_memcpy(pEngine->variableNames[uVar25],puVar22,lVar27 + 1U);
            puVar22 = (ushort *)((long)puVar22 + lVar27 + 1);
          }
          uVar26 = 0;
          if ((local_38->globalSettingsFlags & 1) != 0) {
            pEngine->settings = local_38->pGlobalSettingsBuffer;
          }
        }
        else {
          uVar26 = 0xfffffffc;
        }
      }
      else {
        uVar26 = 0xfffffffd;
      }
    }
  }
  else {
    uVar26 = 0xffffffff;
  }
  return uVar26;
}

Assistant:

uint32_t FACT_INTERNAL_ParseAudioEngine(
	FACTAudioEngine *pEngine,
	const FACTRuntimeParameters *pParams
) {
	uint32_t	categoryOffset,
			variableOffset,
			blob1Offset,
			categoryNameIndexOffset,
			blob2Offset,
			variableNameIndexOffset,
			categoryNameOffset,
			variableNameOffset,
			rpcOffset,
			dspPresetOffset,
			dspParameterOffset;
	uint16_t blob1Count, blob2Count;
	uint8_t version, tool;
	uint8_t se;
	uint32_t magic;
	size_t memsize;
	uint16_t i, j;

	uint8_t *ptr = (uint8_t*) pParams->pGlobalSettingsBuffer;
	uint8_t *start = ptr;

	magic = read_u32(&ptr, 0);
	se = magic == 0x58475346; /* Swap Endian */
	if (magic != 0x46534758 && magic != 0x58475346) /* 'XGSF' */
	{
		return -1; /* TODO: NOT XACT FILE */
	}

	if (!FACT_INTERNAL_SupportedContent(read_u16(&ptr, se)))
	{
		return -2;
	}

	tool = read_u16(&ptr, se); /* Tool version */
	if (tool != 42)
	{
		return -3;
	}

	ptr += 2; /* Unknown value */

	/* Last modified, unused */
	ptr += 8;

	/* XACT Version (Windows == 3, Xbox == 7) */
	version = read_u8(&ptr);
	if (	version != 3 &&
		version != 7	)
	{
		return -4; /* TODO: VERSION TOO OLD */
	}

	/* Object counts */
	pEngine->categoryCount = read_u16(&ptr, se);
	pEngine->variableCount = read_u16(&ptr, se);
	blob1Count = read_u16(&ptr, se);
	blob2Count = read_u16(&ptr, se);
	pEngine->rpcCount = read_u16(&ptr, se);
	pEngine->dspPresetCount = read_u16(&ptr, se);
	pEngine->dspParameterCount = read_u16(&ptr, se);

	/* Object offsets */
	categoryOffset = read_u32(&ptr, se);
	variableOffset = read_u32(&ptr, se);
	blob1Offset = read_u32(&ptr, se);
	categoryNameIndexOffset = read_u32(&ptr, se);
	blob2Offset = read_u32(&ptr, se);
	variableNameIndexOffset = read_u32(&ptr, se);
	categoryNameOffset = read_u32(&ptr, se);
	variableNameOffset = read_u32(&ptr, se);
	rpcOffset = read_u32(&ptr, se);
	dspPresetOffset = read_u32(&ptr, se);
	dspParameterOffset = read_u32(&ptr, se);

	/* Category data */
	FAudio_assert((ptr - start) == categoryOffset);
	pEngine->categories = (FACTAudioCategory*) pEngine->pMalloc(
		sizeof(FACTAudioCategory) * pEngine->categoryCount
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		pEngine->categories[i].instanceLimit = read_u8(&ptr);
		pEngine->categories[i].fadeInMS = read_u16(&ptr, se);
		pEngine->categories[i].fadeOutMS = read_u16(&ptr, se);
		pEngine->categories[i].maxInstanceBehavior = read_u8(&ptr) >> 3;
		pEngine->categories[i].parentCategory = read_u16(&ptr, se);
		pEngine->categories[i].volume = FACT_INTERNAL_CalculateAmplitudeRatio(
			read_volbyte(&ptr)
		);
		pEngine->categories[i].visibility = read_u8(&ptr);
		pEngine->categories[i].instanceCount = 0;
		pEngine->categories[i].currentVolume = 1.0f;
	}

	/* Variable data */
	FAudio_assert((ptr - start) == variableOffset);
	pEngine->variables = (FACTVariable*) pEngine->pMalloc(
		sizeof(FACTVariable) * pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->variables[i].accessibility = read_u8(&ptr);
		pEngine->variables[i].initialValue = read_f32(&ptr, se);
		pEngine->variables[i].minValue = read_f32(&ptr, se);
		pEngine->variables[i].maxValue = read_f32(&ptr, se);
	}

	/* Global variable storage. Some unused data for non-global vars */
	pEngine->globalVariableValues = (float*) pEngine->pMalloc(
		sizeof(float) * pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->globalVariableValues[i] = pEngine->variables[i].initialValue;
	}

	/* RPC data */
	if (pEngine->rpcCount > 0)
	{
		FAudio_assert((ptr - start) == rpcOffset);
		pEngine->rpcs = (FACTRPC*) pEngine->pMalloc(
			sizeof(FACTRPC) *
			pEngine->rpcCount
		);
		pEngine->rpcCodes = (uint32_t*) pEngine->pMalloc(
			sizeof(uint32_t) *
			pEngine->rpcCount
		);
		for (i = 0; i < pEngine->rpcCount; i += 1)
		{
			pEngine->rpcCodes[i] = (uint32_t) (ptr - start);
			pEngine->rpcs[i].variable = read_u16(&ptr, se);
			pEngine->rpcs[i].pointCount = read_u8(&ptr);
			pEngine->rpcs[i].parameter = read_u16(&ptr, se);
			pEngine->rpcs[i].points = (FACTRPCPoint*) pEngine->pMalloc(
				sizeof(FACTRPCPoint) *
				pEngine->rpcs[i].pointCount
			);
			for (j = 0; j < pEngine->rpcs[i].pointCount; j += 1)
			{
				pEngine->rpcs[i].points[j].x = read_f32(&ptr, se);
				pEngine->rpcs[i].points[j].y = read_f32(&ptr, se);
				pEngine->rpcs[i].points[j].type = read_u8(&ptr);
			}
		}
	}

	/* DSP Preset data */
	if (pEngine->dspPresetCount > 0)
	{
		FAudio_assert((ptr - start) == dspPresetOffset);
		pEngine->dspPresets = (FACTDSPPreset*) pEngine->pMalloc(
			sizeof(FACTDSPPreset) *
			pEngine->dspPresetCount
		);
		pEngine->dspPresetCodes = (uint32_t*) pEngine->pMalloc(
			sizeof(uint32_t) *
			pEngine->dspPresetCount
		);
		for (i = 0; i < pEngine->dspPresetCount; i += 1)
		{
			pEngine->dspPresetCodes[i] = (uint32_t) (ptr - start);
			pEngine->dspPresets[i].accessibility = read_u8(&ptr);
			pEngine->dspPresets[i].parameterCount = read_u16(&ptr, se);
			ptr += 2; /* Unknown value */
			pEngine->dspPresets[i].parameters = (FACTDSPParameter*) pEngine->pMalloc(
				sizeof(FACTDSPParameter) *
				pEngine->dspPresets[i].parameterCount
			); /* This will be filled in just a moment... */
		}

		/* DSP Parameter data */
		FAudio_assert((ptr - start) == dspParameterOffset);
		for (i = 0; i < pEngine->dspPresetCount; i += 1)
		{
			for (j = 0; j < pEngine->dspPresets[i].parameterCount; j += 1)
			{
				pEngine->dspPresets[i].parameters[j].type = read_u8(&ptr);
				pEngine->dspPresets[i].parameters[j].value = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].minVal = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].maxVal = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].unknown = read_u16(&ptr, se);
			}
		}
	}

	/* Blob #1, no idea what this is... */
	FAudio_assert((ptr - start) == blob1Offset);
	ptr += blob1Count * 2;

	/* Category Name Index data */
	FAudio_assert((ptr - start) == categoryNameIndexOffset);
	ptr += pEngine->categoryCount * 6; /* FIXME: index as assert value? */

	/* Category Name data */
	FAudio_assert((ptr - start) == categoryNameOffset);
	pEngine->categoryNames = (char**) pEngine->pMalloc(
		sizeof(char*) *
		pEngine->categoryCount
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		memsize = FAudio_strlen((char*) ptr) + 1; /* Dastardly! */
		pEngine->categoryNames[i] = (char*) pEngine->pMalloc(memsize);
		FAudio_memcpy(pEngine->categoryNames[i], ptr, memsize);
		ptr += memsize;
	}

	/* Blob #2, no idea what this is... */
	FAudio_assert((ptr - start) == blob2Offset);
	ptr += blob2Count * 2;

	/* Variable Name Index data */
	FAudio_assert((ptr - start) == variableNameIndexOffset);
	ptr += pEngine->variableCount * 6; /* FIXME: index as assert value? */

	/* Variable Name data */
	FAudio_assert((ptr - start) == variableNameOffset);
	pEngine->variableNames = (char**) pEngine->pMalloc(
		sizeof(char*) *
		pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		memsize = FAudio_strlen((char*) ptr) + 1; /* Dastardly! */
		pEngine->variableNames[i] = (char*) pEngine->pMalloc(memsize);
		FAudio_memcpy(pEngine->variableNames[i], ptr, memsize);
		ptr += memsize;
	}

	/* Store this pointer in case we're asked to free it */
	if (pParams->globalSettingsFlags & FACT_FLAG_MANAGEDATA)
	{
		pEngine->settings = pParams->pGlobalSettingsBuffer;
	}

	/* Finally. */
	FAudio_assert((ptr - start) == pParams->globalSettingsBufferSize);
	return 0;
}